

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void __thiscall
wasm::ModuleUtils::
ParallelFunctionAnalysis<Info,_(wasm::Mutability)0,_wasm::ModuleUtils::DefaultMap>::
ParallelFunctionAnalysis::Mapper::~Mapper(Mapper *this)

{
  Mapper *this_local;
  
  *(undefined ***)this = &PTR__Mapper_02719d60;
  std::function<void_(wasm::Function_*,_Info_&)>::~function
            ((function<void_(wasm::Function_*,_Info_&)> *)(this + 0x118));
  WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_>::~WalkerPass
            ((WalkerPass<wasm::PostWalker<Mapper,_wasm::Visitor<Mapper,_void>_>_> *)this);
  return;
}

Assistant:

bool modifiesBinaryenIR() override { return Mut; }